

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall
fasttext::DenseMatrix::multiplyRow(DenseMatrix *this,Vector *nums,int64_t ib,int64_t ie)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  int64_t iVar5;
  int j;
  long lVar6;
  
  if (ie == -1) {
    ie = (this->super_Matrix).m_;
  }
  if (ie <= (long)(nums->data_).size_) {
    if (ib < ie) {
      lVar2 = (this->super_Matrix).n_;
      pfVar4 = (this->data_).mem_ + lVar2 * ib;
      pfVar3 = (nums->data_).mem_;
      iVar5 = ib;
      do {
        fVar1 = pfVar3[iVar5 - ib];
        if (fVar1 != 0.0 && 0 < lVar2) {
          lVar6 = 0;
          do {
            pfVar4[lVar6] = pfVar4[lVar6] * fVar1;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
        iVar5 = iVar5 + 1;
        pfVar4 = pfVar4 + lVar2;
      } while (iVar5 != ie);
    }
    return;
  }
  __assert_fail("ie <= nums.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/densematrix.cc"
                ,0x44,"void fasttext::DenseMatrix::multiplyRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void DenseMatrix::multiplyRow(const Vector& nums, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= nums.size());
  for (auto i = ib; i < ie; i++) {
    real n = nums[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) *= n;
      }
    }
  }
}